

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

bool __thiscall
lan::db::set_bit<bool>
          (db *this,db_bit *context,db_bit *var,string *name,db_bit_type type,bool value)

{
  byte *pbVar1;
  string local_50;
  byte local_2d;
  db_bit_type local_2c;
  bool value_local;
  string *psStack_28;
  db_bit_type type_local;
  string *name_local;
  db_bit *var_local;
  db_bit *context_local;
  db *this_local;
  
  local_2d = value;
  local_2c = type;
  psStack_28 = name;
  name_local = &var->key;
  var_local = context;
  context_local = (db_bit *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  set_bit(this,context,var,&local_50,local_2c);
  std::__cxx11::string::~string((string *)&local_50);
  pbVar1 = (byte *)operator_new(1);
  *pbVar1 = local_2d & 1;
  name_local[1]._M_string_length = (size_type)pbVar1;
  return name_local[1]._M_string_length != 0;
}

Assistant:

bool set_bit(db_bit * context, db_bit * var,std::string const name, db_bit_type const type, any const value){
            set_bit(context, var, name, type);
            var->data = new any (value);
            return (var->data);
        }